

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_vec3 rf_unproject(rf_vec3 source,rf_mat proj,rf_mat view)

{
  rf_mat mat;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  rf_vec3 rVar4;
  undefined8 unaff_retaddr;
  rf_mat mat_viewProj;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  fVar3 = source.z;
  rf_mat_mul(view,proj);
  mat.m8 = (float)(int)in_stack_ffffffffffffffd8;
  mat.m12 = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  mat.m0 = (float)(int)in_stack_ffffffffffffffd0;
  mat.m4 = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  mat.m1 = (float)(int)in_stack_ffffffffffffffe0;
  mat.m5 = (float)(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  mat.m9 = (float)(int)in_stack_ffffffffffffffe8;
  mat.m13 = (float)(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  mat.m2 = (float)(int)unaff_RBX;
  mat.m6 = (float)(int)((ulong)unaff_RBX >> 0x20);
  mat.m10 = (float)(int)unaff_R14;
  mat.m14 = (float)(int)((ulong)unaff_R14 >> 0x20);
  mat.m11 = proj.m0;
  mat.m15 = proj.m4;
  mat._48_8_ = unaff_retaddr;
  rf_mat_invert(mat);
  local_98 = (float)local_50;
  uStack_90 = (float)uStack_48;
  uStack_8c = (float)((ulong)uStack_48 >> 0x20);
  uStack_94 = (float)((ulong)local_50 >> 0x20);
  local_88 = (float)local_40;
  uStack_84 = (float)((ulong)local_40 >> 0x20);
  uStack_80 = (float)uStack_38;
  local_78 = (float)in_stack_ffffffffffffffd0;
  uStack_74 = (float)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uStack_70 = (float)in_stack_ffffffffffffffd8;
  uStack_6c = (float)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_b8 = source.x;
  uStack_b4 = source.y;
  local_68 = (float)in_stack_ffffffffffffffe0;
  uStack_64 = (float)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  uStack_60 = (float)in_stack_ffffffffffffffe8;
  uStack_5c = (float)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  uStack_5c = uStack_5c + uStack_60 * fVar3 + local_68 * local_b8 + uStack_64 * uStack_b4;
  uStack_7c = (float)((ulong)uStack_38 >> 0x20);
  auVar1._0_4_ = uStack_8c + uStack_90 * fVar3 + local_98 * local_b8 + uStack_94 * uStack_b4;
  auVar1._4_4_ = uStack_7c + uStack_80 * fVar3 + local_88 * local_b8 + uStack_84 * uStack_b4;
  auVar1._8_4_ = uStack_84 + local_88 * fVar3 + uStack_90 * local_b8 + uStack_8c * uStack_b4;
  auVar1._12_4_ = uStack_80 + uStack_84 * fVar3 + uStack_8c * local_b8 + local_88 * uStack_b4;
  auVar2._4_4_ = uStack_5c;
  auVar2._0_4_ = uStack_5c;
  auVar2._8_4_ = uStack_5c;
  auVar2._12_4_ = uStack_5c;
  auVar2 = divps(auVar1,auVar2);
  rVar4.z = (uStack_6c + uStack_70 * fVar3 + local_78 * local_b8 + uStack_74 * uStack_b4) /
            uStack_5c;
  rVar4._0_8_ = auVar2._0_8_;
  return rVar4;
}

Assistant:

RF_API rf_vec3 rf_unproject(rf_vec3 source, rf_mat proj, rf_mat view)
{
    rf_vec3 result = {0.0f, 0.0f, 0.0f};

    // Calculate unproject matrix (multiply view patrix by rf_ctx->gl_ctx.projection matrix) and invert it
    rf_mat mat_viewProj = rf_mat_mul(view, proj);
    mat_viewProj = rf_mat_invert(mat_viewProj);

    // Create quaternion from source point
    rf_quaternion quat = {source.x, source.y, source.z, 1.0f};

    // Multiply quat point by unproject matrix
    quat = rf_quaternion_transform(quat, mat_viewProj);

    // Normalized world points in vectors
    result.x = quat.x / quat.w;
    result.y = quat.y / quat.w;
    result.z = quat.z / quat.w;

    return result;
}